

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eccommit_impl.h
# Opt level: O3

int secp256k1_ec_commit_verify
              (secp256k1_ge *commitp,secp256k1_ge *pubp,secp256k1_sha256 *sha,uchar *data,
              size_t data_size)

{
  int iVar1;
  secp256k1_ge p;
  secp256k1_gej pj;
  secp256k1_ge sStack_118;
  secp256k1_gej local_b0;
  
  iVar1 = secp256k1_ec_commit(&sStack_118,pubp,sha,data,data_size);
  if (iVar1 == 0) {
    local_b0.infinity = 0;
  }
  else {
    secp256k1_ge_neg(&sStack_118,&sStack_118);
    secp256k1_gej_set_ge(&local_b0,&sStack_118);
    secp256k1_gej_add_ge_var(&local_b0,&local_b0,commitp,(secp256k1_fe *)0x0);
    secp256k1_gej_verify(&local_b0);
  }
  return local_b0.infinity;
}

Assistant:

static int secp256k1_ec_commit_verify(const secp256k1_ge* commitp, const secp256k1_ge* pubp, secp256k1_sha256* sha, const unsigned char *data, size_t data_size) {
    secp256k1_gej pj;
    secp256k1_ge p;

    if (!secp256k1_ec_commit(&p, pubp, sha, data, data_size)) {
        return 0;
    }

    /* Return p == commitp */
    secp256k1_ge_neg(&p, &p);
    secp256k1_gej_set_ge(&pj, &p);
    secp256k1_gej_add_ge_var(&pj, &pj, commitp, NULL);
    return secp256k1_gej_is_infinity(&pj);
}